

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O3

NodeRefPtr<4> __thiscall
embree::sse2::BVHBuilderBinnedFastSpatialSAH::
CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMv<4>>>::
operator()(CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMv<4>>>
           *this,PrimRef *prims,range<unsigned_long> *range,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined4 *puVar2;
  pointer *pppTVar3;
  ThreadLocal2 *this_00;
  iterator __position;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined1 *puVar17;
  char *pcVar18;
  size_t sVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  char *pcVar24;
  float *pfVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  vuint<4> vprimID;
  undefined8 local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  ulong local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  range<unsigned_long> *local_88;
  CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleMv<4>>>
  *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48 [6];
  
  uVar22 = range->_begin;
  uVar29 = range->_end;
  if (uVar22 < uVar29) {
    puVar17 = (undefined1 *)((long)&prims[uVar22].lower.field_0 + 0xc);
    do {
      puVar17[3] = puVar17[3] & 7;
      uVar22 = uVar22 + 1;
      uVar29 = range->_end;
      puVar17 = puVar17 + 0x20;
    } while (uVar22 < uVar29);
    uVar22 = range->_begin;
  }
  uVar29 = (uVar29 - uVar22) + 3;
  local_f0 = uVar29 >> 2;
  local_108 = local_f0 * 0xb0;
  this_00 = (alloc.talloc1)->parent;
  local_80 = this;
  if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
    uStack_b0 = CONCAT71(uStack_b0._1_7_,1);
    local_b8 = this_00;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    local_e8 = &FastAllocator::s_thread_local_allocators_lock;
    uStack_e0 = CONCAT71(uStack_e0._1_7_,1);
    local_78 = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,__position,(ThreadLocal2 **)&local_78);
    }
    else {
      *__position._M_current = this_00;
      pppTVar3 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if ((char)uStack_b0 == '\x01') {
      MutexSys::unlock(&local_b8->mutex);
    }
  }
  uVar27 = local_108;
  (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + local_108;
  sVar19 = (alloc.talloc1)->cur;
  uVar20 = (ulong)(-(int)sVar19 & 0xf);
  uVar23 = sVar19 + local_108 + uVar20;
  (alloc.talloc1)->cur = uVar23;
  if ((alloc.talloc1)->end < uVar23) {
    (alloc.talloc1)->cur = sVar19;
    uVar20 = (alloc.talloc1)->allocBlockSize;
    if (local_108 * 4 < uVar20 || local_108 * 4 - uVar20 == 0) {
      local_e8 = (undefined8 *)uVar20;
      pcVar24 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_e8);
      (alloc.talloc1)->ptr = pcVar24;
      sVar19 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
      (alloc.talloc1)->bytesWasted = sVar19;
      (alloc.talloc1)->end = (size_t)local_e8;
      (alloc.talloc1)->cur = uVar27;
      if (local_e8 < uVar27) {
        (alloc.talloc1)->cur = 0;
        local_e8 = (undefined8 *)(alloc.talloc1)->allocBlockSize;
        pcVar24 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_e8);
        (alloc.talloc1)->ptr = pcVar24;
        sVar19 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar19;
        (alloc.talloc1)->end = (size_t)local_e8;
        (alloc.talloc1)->cur = uVar27;
        if (local_e8 < uVar27) {
          (alloc.talloc1)->cur = 0;
          pcVar24 = (char *)0x0;
        }
        else {
          (alloc.talloc1)->bytesWasted = sVar19;
        }
      }
      else {
        (alloc.talloc1)->bytesWasted = sVar19;
      }
    }
    else {
      pcVar24 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_108);
    }
  }
  else {
    (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar20;
    pcVar24 = (alloc.talloc1)->ptr + (uVar23 - local_108);
  }
  if (3 < uVar29) {
    lVar26 = local_f0 + (local_f0 == 0);
    lVar21 = 0;
    local_88 = range;
    do {
      uVar29 = range->_end;
      fVar33 = -NAN;
      fVar30 = -NAN;
      fVar31 = -NAN;
      fVar32 = -NAN;
      local_108._0_4_ = 0xffffffff;
      local_108._4_4_ = 0xffffffff;
      uStack_100 = 0xffffffff;
      uStack_fc = 0xffffffff;
      local_48[0] = -NAN;
      local_48[1] = -NAN;
      local_48[2] = -NAN;
      local_48[3] = -NAN;
      local_c8 = 0;
      uStack_c0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      local_e8 = (undefined8 *)0x0;
      uStack_e0 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = (ThreadLocal2 *)0x0;
      uStack_b0 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = (ThreadLocal2 *)0x0;
      uStack_70 = 0;
      if (uVar22 < uVar29) {
        lVar4 = *(long *)(*(long *)(*(long *)local_80 + 0x68) + 0x1e8);
        pfVar25 = prims[uVar22].upper.field_0.m128 + 3;
        uVar27 = 0;
        do {
          fVar30 = *pfVar25;
          lVar5 = *(long *)(lVar4 + (ulong)(uint)pfVar25[-4] * 8);
          lVar28 = (ulong)(uint)fVar30 * *(long *)(lVar5 + 0x68);
          lVar6 = *(long *)(lVar5 + 0x58);
          lVar7 = *(long *)(lVar5 + 0x90);
          lVar5 = *(long *)(lVar5 + 0xa0);
          puVar2 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar6 + lVar28) * lVar5);
          uVar8 = *puVar2;
          uVar9 = puVar2[1];
          uVar10 = puVar2[2];
          puVar2 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar6 + 4 + lVar28) * lVar5);
          uVar11 = *puVar2;
          uVar12 = puVar2[1];
          uVar13 = puVar2[2];
          puVar2 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar6 + 8 + lVar28) * lVar5);
          uVar14 = *puVar2;
          uVar15 = puVar2[1];
          uVar16 = puVar2[2];
          *(float *)((long)&local_108 + uVar27 * 4) = pfVar25[-4];
          local_48[uVar27] = fVar30;
          *(undefined4 *)((long)&local_e8 + uVar27 * 4) = uVar8;
          *(undefined4 *)((long)&local_d8 + uVar27 * 4) = uVar9;
          *(undefined4 *)((long)&local_c8 + uVar27 * 4) = uVar10;
          *(undefined4 *)((long)&local_b8 + uVar27 * 4) = uVar11;
          *(undefined4 *)((long)&local_a8 + uVar27 * 4) = uVar12;
          *(undefined4 *)((long)&local_98 + uVar27 * 4) = uVar13;
          *(undefined4 *)((long)&local_78 + uVar27 * 4) = uVar14;
          *(undefined4 *)((long)&local_68 + uVar27 * 4) = uVar15;
          *(undefined4 *)((long)&local_58 + uVar27 * 4) = uVar16;
          uVar20 = uVar27 + 1;
          if (2 < uVar27) break;
          lVar5 = uVar27 + uVar22;
          pfVar25 = pfVar25 + 8;
          uVar27 = uVar20;
        } while (lVar5 + 1U < uVar29);
        uVar22 = uVar22 + uVar20;
        range = local_88;
        fVar30 = local_48[0];
        fVar31 = local_48[1];
        fVar32 = local_48[2];
        fVar33 = local_48[3];
      }
      else {
        uStack_fc = 0xffffffff;
        local_108._0_4_ = 0xffffffff;
        local_108._4_4_ = 0xffffffff;
        uStack_100 = 0xffffffff;
        local_58._0_4_ = 0;
        local_58._4_4_ = 0;
        uStack_50._0_4_ = 0;
        uStack_50._4_4_ = 0;
        local_68._0_4_ = 0;
        local_68._4_4_ = 0;
        uStack_60._0_4_ = 0;
        uStack_60._4_4_ = 0;
        local_78._0_4_ = 0;
        local_78._4_4_ = 0;
        uStack_70._0_4_ = 0;
        uStack_70._4_4_ = 0;
        local_98._0_4_ = 0;
        local_98._4_4_ = 0;
        uStack_90._0_4_ = 0;
        uStack_90._4_4_ = 0;
        local_a8._0_4_ = 0;
        local_a8._4_4_ = 0;
        uStack_a0._0_4_ = 0;
        uStack_a0._4_4_ = 0;
        local_b8._0_4_ = 0;
        local_b8._4_4_ = 0;
        uStack_b0._0_4_ = 0;
        uStack_b0._4_4_ = 0;
        local_c8._0_4_ = 0;
        local_c8._4_4_ = 0;
        uStack_c0._0_4_ = 0;
        uStack_c0._4_4_ = 0;
        local_d8._0_4_ = 0;
        local_d8._4_4_ = 0;
        uStack_d0._0_4_ = 0;
        uStack_d0._4_4_ = 0;
        local_e8._0_4_ = 0;
        local_e8._4_4_ = 0;
        uStack_e0._0_4_ = 0;
        uStack_e0._4_4_ = 0;
      }
      pcVar18 = pcVar24 + lVar21 * 0xb0;
      *(undefined4 *)pcVar18 = (undefined4)local_e8;
      *(undefined4 *)(pcVar18 + 4) = local_e8._4_4_;
      *(undefined4 *)(pcVar18 + 8) = (undefined4)uStack_e0;
      *(undefined4 *)(pcVar18 + 0xc) = uStack_e0._4_4_;
      *(undefined4 *)(pcVar18 + 0x10) = (undefined4)local_d8;
      *(undefined4 *)(pcVar18 + 0x14) = local_d8._4_4_;
      *(undefined4 *)(pcVar18 + 0x18) = (undefined4)uStack_d0;
      *(undefined4 *)(pcVar18 + 0x1c) = uStack_d0._4_4_;
      *(undefined4 *)(pcVar18 + 0x20) = (undefined4)local_c8;
      *(undefined4 *)(pcVar18 + 0x24) = local_c8._4_4_;
      *(undefined4 *)(pcVar18 + 0x28) = (undefined4)uStack_c0;
      *(undefined4 *)(pcVar18 + 0x2c) = uStack_c0._4_4_;
      *(undefined4 *)(pcVar18 + 0x30) = (undefined4)local_b8;
      *(undefined4 *)(pcVar18 + 0x34) = local_b8._4_4_;
      *(undefined4 *)(pcVar18 + 0x38) = (undefined4)uStack_b0;
      *(undefined4 *)(pcVar18 + 0x3c) = uStack_b0._4_4_;
      *(undefined4 *)(pcVar18 + 0x40) = (undefined4)local_a8;
      *(undefined4 *)(pcVar18 + 0x44) = local_a8._4_4_;
      *(undefined4 *)(pcVar18 + 0x48) = (undefined4)uStack_a0;
      *(undefined4 *)(pcVar18 + 0x4c) = uStack_a0._4_4_;
      *(undefined4 *)(pcVar18 + 0x50) = (undefined4)local_98;
      *(undefined4 *)(pcVar18 + 0x54) = local_98._4_4_;
      *(undefined4 *)(pcVar18 + 0x58) = (undefined4)uStack_90;
      *(undefined4 *)(pcVar18 + 0x5c) = uStack_90._4_4_;
      *(undefined4 *)(pcVar18 + 0x60) = (undefined4)local_78;
      *(undefined4 *)(pcVar18 + 100) = local_78._4_4_;
      *(undefined4 *)(pcVar18 + 0x68) = (undefined4)uStack_70;
      *(undefined4 *)(pcVar18 + 0x6c) = uStack_70._4_4_;
      *(undefined4 *)(pcVar18 + 0x70) = (undefined4)local_68;
      *(undefined4 *)(pcVar18 + 0x74) = local_68._4_4_;
      *(undefined4 *)(pcVar18 + 0x78) = (undefined4)uStack_60;
      *(undefined4 *)(pcVar18 + 0x7c) = uStack_60._4_4_;
      *(undefined4 *)(pcVar18 + 0x80) = (undefined4)local_58;
      *(undefined4 *)(pcVar18 + 0x84) = local_58._4_4_;
      *(undefined4 *)(pcVar18 + 0x88) = (undefined4)uStack_50;
      *(undefined4 *)(pcVar18 + 0x8c) = uStack_50._4_4_;
      *(undefined4 *)(pcVar18 + 0x90) = (undefined4)local_108;
      *(undefined4 *)(pcVar18 + 0x94) = local_108._4_4_;
      *(undefined4 *)(pcVar18 + 0x98) = uStack_100;
      *(undefined4 *)(pcVar18 + 0x9c) = uStack_fc;
      *(float *)(pcVar18 + 0xa0) = fVar30;
      *(float *)(pcVar18 + 0xa4) = fVar31;
      *(float *)(pcVar18 + 0xa8) = fVar32;
      *(float *)(pcVar18 + 0xac) = fVar33;
      lVar21 = lVar21 + 1;
    } while (lVar21 != lVar26);
  }
  uVar22 = 7;
  if (local_f0 < 7) {
    uVar22 = local_f0;
  }
  return (NodeRefPtr<4>)(uVar22 | (ulong)pcVar24 | 8);
}

Assistant:

__noinline ReductionTy operator() (PrimRef* prims, const range<size_t>& range, Allocator alloc) const
        {
          for (size_t i=range.begin(); i<range.end(); i++)
            prims[i].lower.u &= GEOMID_MASK;

          return userCreateLeaf(prims,range,alloc);
        }